

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.h
# Opt level: O1

BSDF * __thiscall
pbrt::CoatedConductorMaterial::GetBSDF<pbrt::UniversalTextureEvaluator>
          (BSDF *__return_storage_ptr__,CoatedConductorMaterial *this,TextureEvalContext *param_3,
          SampledWavelengths *param_4,undefined8 *param_5)

{
  uint8_t uVar1;
  undefined2 uVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  BSDF *pBVar9;
  undefined4 extraout_var;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  float fVar12;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined8 uVar17;
  undefined1 auVar13 [64];
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc_00;
  undefined8 uVar18;
  undefined1 auVar14 [64];
  undefined1 auVar19 [56];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar20 [16];
  ulong uVar22;
  undefined8 uVar24;
  undefined1 auVar23 [56];
  undefined1 auVar21 [64];
  undefined1 auVar25 [16];
  SampledSpectrum SVar26;
  UniversalTextureEvaluator local_419;
  Float local_418;
  Float local_414;
  float local_410;
  undefined4 local_40c;
  undefined1 local_408 [16];
  BSDF *local_3f0;
  int local_3e8;
  int iStack_3e4;
  int iStack_3e0;
  int iStack_3dc;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  Float local_398;
  undefined4 uStack_394;
  undefined4 uStack_390;
  undefined4 uStack_38c;
  Float local_388;
  undefined4 uStack_384;
  undefined4 uStack_380;
  undefined4 uStack_37c;
  BxDFHandle local_370;
  uintptr_t local_368;
  uintptr_t local_360;
  uintptr_t local_358;
  uintptr_t local_350;
  uintptr_t local_348;
  uintptr_t local_340;
  uintptr_t local_338;
  uintptr_t local_330;
  uintptr_t local_328;
  uintptr_t local_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 uStack_280;
  undefined8 local_278;
  ulong uStack_270;
  undefined8 uStack_268;
  undefined8 uStack_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 uStack_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 uStack_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 uStack_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 uStack_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  
  local_320 = (this->interfaceURoughness).
              super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
              .bits;
  local_78._0_4_ = (param_3->p).super_Tuple3<pbrt::Point3,_float>.x;
  local_78._4_4_ = (param_3->p).super_Tuple3<pbrt::Point3,_float>.y;
  uStack_70 = *(undefined8 *)&(param_3->p).super_Tuple3<pbrt::Point3,_float>.z;
  uStack_68._0_4_ = (param_3->dpdx).super_Tuple3<pbrt::Vector3,_float>.y;
  uStack_68._4_4_ = (param_3->dpdx).super_Tuple3<pbrt::Vector3,_float>.z;
  uStack_60._0_4_ = (param_3->dpdy).super_Tuple3<pbrt::Vector3,_float>.x;
  uStack_60._4_4_ = (param_3->dpdy).super_Tuple3<pbrt::Vector3,_float>.y;
  uStack_58 = *(undefined8 *)&(param_3->dpdy).super_Tuple3<pbrt::Vector3,_float>.z;
  uStack_50 = *(undefined8 *)&(param_3->uv).super_Tuple2<pbrt::Point2,_float>.y;
  uStack_48._0_4_ = param_3->dudy;
  uStack_48._4_4_ = param_3->dvdx;
  uStack_40._0_4_ = param_3->dvdy;
  uStack_40._4_4_ = param_3->faceIndex;
  local_3f0 = __return_storage_ptr__;
  local_408._0_4_ =
       UniversalTextureEvaluator::operator()(&local_419,(FloatTextureHandle)&local_320,*param_3);
  local_328 = (this->interfaceVRoughness).
              super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
              .bits;
  local_b8._0_4_ = (param_3->p).super_Tuple3<pbrt::Point3,_float>.x;
  local_b8._4_4_ = (param_3->p).super_Tuple3<pbrt::Point3,_float>.y;
  uStack_b0 = *(undefined8 *)&(param_3->p).super_Tuple3<pbrt::Point3,_float>.z;
  uStack_a8._0_4_ = (param_3->dpdx).super_Tuple3<pbrt::Vector3,_float>.y;
  uStack_a8._4_4_ = (param_3->dpdx).super_Tuple3<pbrt::Vector3,_float>.z;
  uStack_a0._0_4_ = (param_3->dpdy).super_Tuple3<pbrt::Vector3,_float>.x;
  uStack_a0._4_4_ = (param_3->dpdy).super_Tuple3<pbrt::Vector3,_float>.y;
  uStack_98 = *(undefined8 *)&(param_3->dpdy).super_Tuple3<pbrt::Vector3,_float>.z;
  uStack_90 = *(undefined8 *)&(param_3->uv).super_Tuple2<pbrt::Point2,_float>.y;
  uStack_88._0_4_ = param_3->dudy;
  uStack_88._4_4_ = param_3->dvdx;
  uStack_80._0_4_ = param_3->dvdy;
  uStack_80._4_4_ = param_3->faceIndex;
  auVar13._0_4_ =
       UniversalTextureEvaluator::operator()(&local_419,(FloatTextureHandle)&local_328,*param_3);
  auVar13._4_60_ = extraout_var_00;
  auVar10 = auVar13._0_16_;
  if (this->remapRoughness == true) {
    if ((float)local_408._0_4_ < 0.0) {
      local_414 = auVar13._0_4_;
      fVar12 = sqrtf((float)local_408._0_4_);
      auVar10 = ZEXT416((uint)local_414);
    }
    else {
      auVar11 = vsqrtss_avx(ZEXT416((uint)local_408._0_4_),ZEXT416((uint)local_408._0_4_));
      fVar12 = auVar11._0_4_;
    }
    local_408._0_4_ = fVar12;
    if (0.0 <= auVar10._0_4_) {
      auVar10 = vsqrtss_avx(auVar10,auVar10);
      goto LAB_00323d72;
    }
    local_414 = sqrtf(auVar10._0_4_);
  }
  else {
LAB_00323d72:
    local_414 = auVar10._0_4_;
  }
  local_330 = (this->thickness).
              super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
              .bits;
  local_f8._0_4_ = (param_3->p).super_Tuple3<pbrt::Point3,_float>.x;
  local_f8._4_4_ = (param_3->p).super_Tuple3<pbrt::Point3,_float>.y;
  uStack_f0 = *(undefined8 *)&(param_3->p).super_Tuple3<pbrt::Point3,_float>.z;
  uStack_e8._0_4_ = (param_3->dpdx).super_Tuple3<pbrt::Vector3,_float>.y;
  uStack_e8._4_4_ = (param_3->dpdx).super_Tuple3<pbrt::Vector3,_float>.z;
  uStack_e0._0_4_ = (param_3->dpdy).super_Tuple3<pbrt::Vector3,_float>.x;
  uStack_e0._4_4_ = (param_3->dpdy).super_Tuple3<pbrt::Vector3,_float>.y;
  uStack_d8 = *(undefined8 *)&(param_3->dpdy).super_Tuple3<pbrt::Vector3,_float>.z;
  uStack_d0 = *(undefined8 *)&(param_3->uv).super_Tuple2<pbrt::Point2,_float>.y;
  uStack_c8._0_4_ = param_3->dudy;
  uStack_c8._4_4_ = param_3->dvdx;
  uStack_c0._0_4_ = param_3->dvdy;
  uStack_c0._4_4_ = param_3->faceIndex;
  local_388 = UniversalTextureEvaluator::operator()
                        (&local_419,(FloatTextureHandle)&local_330,*param_3);
  local_338 = (this->interfaceEta).
              super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
              .bits;
  local_138._0_4_ = (param_3->p).super_Tuple3<pbrt::Point3,_float>.x;
  local_138._4_4_ = (param_3->p).super_Tuple3<pbrt::Point3,_float>.y;
  uStack_130 = *(undefined8 *)&(param_3->p).super_Tuple3<pbrt::Point3,_float>.z;
  uStack_128._0_4_ = (param_3->dpdx).super_Tuple3<pbrt::Vector3,_float>.y;
  uStack_128._4_4_ = (param_3->dpdx).super_Tuple3<pbrt::Vector3,_float>.z;
  uStack_120._0_4_ = (param_3->dpdy).super_Tuple3<pbrt::Vector3,_float>.x;
  uStack_120._4_4_ = (param_3->dpdy).super_Tuple3<pbrt::Vector3,_float>.y;
  uStack_118 = *(undefined8 *)&(param_3->dpdy).super_Tuple3<pbrt::Vector3,_float>.z;
  uStack_110 = *(undefined8 *)&(param_3->uv).super_Tuple2<pbrt::Point2,_float>.y;
  uStack_108._0_4_ = param_3->dudy;
  uStack_108._4_4_ = param_3->dvdx;
  uStack_100._0_4_ = param_3->dvdy;
  uStack_100._4_4_ = param_3->faceIndex;
  uVar24 = 0;
  uStack_384 = extraout_XMM0_Db;
  uStack_380 = extraout_XMM0_Dc;
  uStack_37c = extraout_XMM0_Dd;
  local_398 = UniversalTextureEvaluator::operator()
                        (&local_419,(FloatTextureHandle)&local_338,*param_3);
  local_340 = (this->conductorEta).
              super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
              .bits;
  local_178._0_4_ = (param_3->p).super_Tuple3<pbrt::Point3,_float>.x;
  local_178._4_4_ = (param_3->p).super_Tuple3<pbrt::Point3,_float>.y;
  uVar17 = *(undefined8 *)&(param_3->p).super_Tuple3<pbrt::Point3,_float>.z;
  uStack_168._0_4_ = (param_3->dpdx).super_Tuple3<pbrt::Vector3,_float>.y;
  uStack_168._4_4_ = (param_3->dpdx).super_Tuple3<pbrt::Vector3,_float>.z;
  uStack_160._0_4_ = (param_3->dpdy).super_Tuple3<pbrt::Vector3,_float>.x;
  uStack_160._4_4_ = (param_3->dpdy).super_Tuple3<pbrt::Vector3,_float>.y;
  uStack_158 = *(undefined8 *)&(param_3->dpdy).super_Tuple3<pbrt::Vector3,_float>.z;
  uStack_150 = *(undefined8 *)&(param_3->uv).super_Tuple2<pbrt::Point2,_float>.y;
  uStack_148._0_4_ = param_3->dudy;
  uStack_148._4_4_ = param_3->dvdx;
  uStack_140._0_4_ = param_3->dvdy;
  uStack_140._4_4_ = param_3->faceIndex;
  local_2d8 = *(undefined8 *)(param_4->lambda).values;
  uStack_2d0 = *(undefined8 *)((param_4->lambda).values + 2);
  uStack_2c8 = *(undefined8 *)(param_4->pdf).values;
  uStack_2c0 = *(undefined8 *)((param_4->pdf).values + 2);
  uStack_394 = extraout_XMM0_Db_00;
  uStack_390 = extraout_XMM0_Dc_00;
  uStack_38c = extraout_XMM0_Dd_00;
  uStack_170 = uVar17;
  SVar26 = UniversalTextureEvaluator::operator()
                     (&local_419,(SpectrumTextureHandle)&local_340,*param_3,*param_4);
  local_3b8 = SVar26.values.values._8_8_;
  local_3a8 = SVar26.values.values._0_8_;
  local_348 = (this->k).
              super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
              .bits;
  local_1b8._0_4_ = (param_3->p).super_Tuple3<pbrt::Point3,_float>.x;
  local_1b8._4_4_ = (param_3->p).super_Tuple3<pbrt::Point3,_float>.y;
  uVar18 = *(undefined8 *)&(param_3->p).super_Tuple3<pbrt::Point3,_float>.z;
  uStack_1a8._0_4_ = (param_3->dpdx).super_Tuple3<pbrt::Vector3,_float>.y;
  uStack_1a8._4_4_ = (param_3->dpdx).super_Tuple3<pbrt::Vector3,_float>.z;
  uStack_1a0._0_4_ = (param_3->dpdy).super_Tuple3<pbrt::Vector3,_float>.x;
  uStack_1a0._4_4_ = (param_3->dpdy).super_Tuple3<pbrt::Vector3,_float>.y;
  uStack_198 = *(undefined8 *)&(param_3->dpdy).super_Tuple3<pbrt::Vector3,_float>.z;
  uStack_190 = *(undefined8 *)&(param_3->uv).super_Tuple2<pbrt::Point2,_float>.y;
  uStack_188._0_4_ = param_3->dudy;
  uStack_188._4_4_ = param_3->dvdx;
  uStack_180._0_4_ = param_3->dvdy;
  uStack_180._4_4_ = param_3->faceIndex;
  local_2f8 = *(undefined8 *)(param_4->lambda).values;
  uStack_2f0 = *(undefined8 *)((param_4->lambda).values + 2);
  uStack_2e8 = *(undefined8 *)(param_4->pdf).values;
  uStack_2e0 = *(undefined8 *)((param_4->pdf).values + 2);
  uStack_3b0 = uVar24;
  uStack_3a0 = uVar17;
  uStack_1b0 = uVar18;
  SVar26 = UniversalTextureEvaluator::operator()
                     (&local_419,(SpectrumTextureHandle)&local_348,*param_3,*param_4);
  local_3d8 = SVar26.values.values._8_8_;
  local_3c8 = SVar26.values.values._0_8_;
  local_350 = (this->conductorURoughness).
              super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
              .bits;
  local_1f8._0_4_ = (param_3->p).super_Tuple3<pbrt::Point3,_float>.x;
  local_1f8._4_4_ = (param_3->p).super_Tuple3<pbrt::Point3,_float>.y;
  uStack_1f0 = *(undefined8 *)&(param_3->p).super_Tuple3<pbrt::Point3,_float>.z;
  uStack_1e8._0_4_ = (param_3->dpdx).super_Tuple3<pbrt::Vector3,_float>.y;
  uStack_1e8._4_4_ = (param_3->dpdx).super_Tuple3<pbrt::Vector3,_float>.z;
  uStack_1e0._0_4_ = (param_3->dpdy).super_Tuple3<pbrt::Vector3,_float>.x;
  uStack_1e0._4_4_ = (param_3->dpdy).super_Tuple3<pbrt::Vector3,_float>.y;
  uStack_1d8 = *(undefined8 *)&(param_3->dpdy).super_Tuple3<pbrt::Vector3,_float>.z;
  uStack_1d0 = *(undefined8 *)&(param_3->uv).super_Tuple2<pbrt::Point2,_float>.y;
  uStack_1c8._0_4_ = param_3->dudy;
  uStack_1c8._4_4_ = param_3->dvdx;
  uStack_1c0._0_4_ = param_3->dvdy;
  uStack_1c0._4_4_ = param_3->faceIndex;
  uStack_3d0 = uVar24;
  uStack_3c0 = uVar18;
  local_410 = UniversalTextureEvaluator::operator()
                        (&local_419,(FloatTextureHandle)&local_350,*param_3);
  local_358 = (this->conductorVRoughness).
              super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
              .bits;
  local_238._0_4_ = (param_3->p).super_Tuple3<pbrt::Point3,_float>.x;
  local_238._4_4_ = (param_3->p).super_Tuple3<pbrt::Point3,_float>.y;
  uStack_230 = *(undefined8 *)&(param_3->p).super_Tuple3<pbrt::Point3,_float>.z;
  uStack_228._0_4_ = (param_3->dpdx).super_Tuple3<pbrt::Vector3,_float>.y;
  uStack_228._4_4_ = (param_3->dpdx).super_Tuple3<pbrt::Vector3,_float>.z;
  uStack_220._0_4_ = (param_3->dpdy).super_Tuple3<pbrt::Vector3,_float>.x;
  uStack_220._4_4_ = (param_3->dpdy).super_Tuple3<pbrt::Vector3,_float>.y;
  uStack_218 = *(undefined8 *)&(param_3->dpdy).super_Tuple3<pbrt::Vector3,_float>.z;
  uStack_210 = *(undefined8 *)&(param_3->uv).super_Tuple2<pbrt::Point2,_float>.y;
  uStack_208._0_4_ = param_3->dudy;
  uStack_208._4_4_ = param_3->dvdx;
  uStack_200._0_4_ = param_3->dvdy;
  uStack_200._4_4_ = param_3->faceIndex;
  auVar14._0_4_ =
       UniversalTextureEvaluator::operator()(&local_419,(FloatTextureHandle)&local_358,*param_3);
  auVar14._4_60_ = extraout_var_01;
  auVar10 = auVar14._0_16_;
  if (this->remapRoughness == true) {
    if (local_410 < 0.0) {
      local_418 = auVar14._0_4_;
      local_410 = sqrtf(local_410);
      auVar10 = ZEXT416((uint)local_418);
    }
    else {
      auVar11 = vsqrtss_avx(ZEXT416((uint)local_410),ZEXT416((uint)local_410));
      local_410 = auVar11._0_4_;
    }
    uVar22 = auVar10._8_8_;
    if (auVar10._0_4_ < 0.0) {
      local_418 = sqrtf(auVar10._0_4_);
      goto LAB_00323fec;
    }
    auVar10 = vsqrtss_avx(auVar10,auVar10);
  }
  uVar22 = auVar10._8_8_;
  local_418 = auVar10._0_4_;
LAB_00323fec:
  local_360 = (this->albedo).
              super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
              .bits;
  local_278._0_4_ = (param_3->p).super_Tuple3<pbrt::Point3,_float>.x;
  local_278._4_4_ = (param_3->p).super_Tuple3<pbrt::Point3,_float>.y;
  uStack_270 = *(ulong *)&(param_3->p).super_Tuple3<pbrt::Point3,_float>.z;
  uStack_268._0_4_ = (param_3->dpdx).super_Tuple3<pbrt::Vector3,_float>.y;
  uStack_268._4_4_ = (param_3->dpdx).super_Tuple3<pbrt::Vector3,_float>.z;
  uStack_260._0_4_ = (param_3->dpdy).super_Tuple3<pbrt::Vector3,_float>.x;
  uStack_260._4_4_ = (param_3->dpdy).super_Tuple3<pbrt::Vector3,_float>.y;
  uStack_258 = *(undefined8 *)&(param_3->dpdy).super_Tuple3<pbrt::Vector3,_float>.z;
  uStack_250 = *(undefined8 *)&(param_3->uv).super_Tuple2<pbrt::Point2,_float>.y;
  uStack_248._0_4_ = param_3->dudy;
  uStack_248._4_4_ = param_3->dvdx;
  uStack_240._0_4_ = param_3->dvdy;
  uStack_240._4_4_ = param_3->faceIndex;
  local_318 = *(undefined8 *)(param_4->lambda).values;
  uStack_310 = *(undefined8 *)((param_4->lambda).values + 2);
  uStack_308 = *(undefined8 *)(param_4->pdf).values;
  uStack_300 = *(undefined8 *)((param_4->pdf).values + 2);
  auVar19 = ZEXT856(uStack_270);
  auVar23 = ZEXT856(uVar22);
  SVar26 = UniversalTextureEvaluator::operator()
                     (&local_419,(SpectrumTextureHandle)&local_360,*param_3,*param_4);
  auVar21._0_8_ = SVar26.values.values._8_8_;
  auVar21._8_56_ = auVar23;
  auVar15._0_8_ = SVar26.values.values._0_8_;
  auVar15._8_56_ = auVar19;
  auVar10 = vmovlhps_avx(auVar15._0_16_,auVar21._0_16_);
  uVar22 = vcmpps_avx512vl(auVar10,ZEXT816(0) << 0x40,5);
  auVar20._8_4_ = 0x3f800000;
  auVar20._0_8_ = 0x3f8000003f800000;
  auVar20._12_4_ = 0x3f800000;
  auVar10 = vminps_avx512vl(auVar20,auVar10);
  local_3e8 = (uint)((byte)uVar22 & 1) * auVar10._0_4_;
  iStack_3e4 = (uint)((byte)(uVar22 >> 1) & 1) * auVar10._4_4_;
  iStack_3e0 = (uint)((byte)(uVar22 >> 2) & 1) * auVar10._8_4_;
  iStack_3dc = (uint)((byte)(uVar22 >> 3) & 1) * auVar10._12_4_;
  auVar11 = SUB6416(ZEXT464(0x38d1b717),0);
  auVar10 = vmaxss_avx(ZEXT416((uint)local_418),auVar11);
  local_418 = auVar10._0_4_;
  auVar10 = vmaxss_avx(ZEXT416((uint)local_410),auVar11);
  local_40c = auVar10._0_4_;
  auVar10 = vmaxss_avx(ZEXT416((uint)local_414),auVar11);
  local_410 = auVar10._0_4_;
  local_408 = vmaxss_avx(ZEXT416((uint)local_408._0_4_),auVar11);
  local_368 = (this->g).
              super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
              .bits;
  local_2b8._0_4_ = (param_3->p).super_Tuple3<pbrt::Point3,_float>.x;
  local_2b8._4_4_ = (param_3->p).super_Tuple3<pbrt::Point3,_float>.y;
  uStack_2b0 = *(undefined8 *)&(param_3->p).super_Tuple3<pbrt::Point3,_float>.z;
  uStack_2a8._0_4_ = (param_3->dpdx).super_Tuple3<pbrt::Vector3,_float>.y;
  uStack_2a8._4_4_ = (param_3->dpdx).super_Tuple3<pbrt::Vector3,_float>.z;
  uStack_2a0._0_4_ = (param_3->dpdy).super_Tuple3<pbrt::Vector3,_float>.x;
  uStack_2a0._4_4_ = (param_3->dpdy).super_Tuple3<pbrt::Vector3,_float>.y;
  uStack_298 = *(undefined8 *)&(param_3->dpdy).super_Tuple3<pbrt::Vector3,_float>.z;
  uStack_290 = *(undefined8 *)&(param_3->uv).super_Tuple2<pbrt::Point2,_float>.y;
  uStack_288._0_4_ = param_3->dudy;
  uStack_288._4_4_ = param_3->dvdx;
  uStack_280._0_4_ = param_3->dvdy;
  uStack_280._4_4_ = param_3->faceIndex;
  auVar16._0_4_ =
       UniversalTextureEvaluator::operator()(&local_419,(FloatTextureHandle)&local_368,*param_3);
  pBVar9 = local_3f0;
  auVar16._4_60_ = extraout_var_02;
  auVar11 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar16._0_16_);
  auVar7._4_4_ = uStack_394;
  auVar7._0_4_ = local_398;
  auVar7._8_4_ = uStack_390;
  auVar7._12_4_ = uStack_38c;
  uVar17 = vcmpss_avx512f(auVar7,SUB6416(ZEXT464(0x3f800000),0),0);
  bVar3 = (bool)((byte)uVar17 & 1);
  auVar10 = vinsertps_avx(ZEXT416((uint)bVar3 * 0x3f8020c5 + (uint)!bVar3 * (int)local_398),
                          ZEXT416((uint)local_408._0_4_),0x10);
  uVar2 = *(undefined2 *)&this->config;
  uVar1 = (this->config).twoSided;
  uVar17 = vmovlps_avx(auVar10);
  *param_5 = uVar17;
  *(float *)(param_5 + 1) = local_410;
  *(ulong *)((long)param_5 + 0xc) =
       CONCAT44(extraout_var,local_40c) | (ulong)(uint)local_418 << 0x20;
  auVar6._8_8_ = uStack_3a0;
  auVar6._0_8_ = local_3a8;
  auVar5._8_8_ = uStack_3b0;
  auVar5._0_8_ = local_3b8;
  auVar10 = vunpcklpd_avx(auVar6,auVar5);
  *(undefined1 (*) [16])((long)param_5 + 0x14) = auVar10;
  auVar4._8_8_ = uStack_3c0;
  auVar4._0_8_ = local_3c8;
  auVar10._8_8_ = uStack_3d0;
  auVar10._0_8_ = local_3d8;
  auVar10 = vunpcklpd_avx(auVar4,auVar10);
  *(undefined1 (*) [16])((long)param_5 + 0x24) = auVar10;
  auVar8._4_4_ = uStack_384;
  auVar8._0_4_ = local_388;
  auVar8._8_4_ = uStack_380;
  auVar8._12_4_ = uStack_37c;
  auVar10 = vinsertps_avx(auVar8,auVar16._0_16_,0x10);
  auVar25._8_8_ = 0xbf80000000800000;
  auVar25._0_8_ = 0xbf80000000800000;
  uVar22 = vcmpps_avx512vl(auVar10,auVar25,1);
  auVar10 = vinsertps_avx(auVar8,auVar11,0x10);
  bVar3 = (bool)((byte)uVar22 & 1);
  auVar11._0_4_ = (uint)bVar3 * 0x800000 | (uint)!bVar3 * auVar10._0_4_;
  bVar3 = (bool)((byte)(uVar22 >> 1) & 1);
  auVar11._4_4_ = (uint)bVar3 * -0x40800000 | (uint)!bVar3 * auVar10._4_4_;
  bVar3 = (bool)((byte)(uVar22 >> 2) & 1);
  auVar11._8_4_ = (uint)bVar3 * 0x800000 | (uint)!bVar3 * auVar10._8_4_;
  bVar3 = (bool)((byte)(uVar22 >> 3) & 1);
  auVar11._12_4_ = (uint)bVar3 * -0x40800000 | (uint)!bVar3 * auVar10._12_4_;
  uVar17 = vmovlps_avx(auVar11);
  *(undefined8 *)((long)param_5 + 0x34) = uVar17;
  *(ulong *)((long)param_5 + 0x3c) = CONCAT44(iStack_3e4,local_3e8);
  *(ulong *)((long)param_5 + 0x44) = CONCAT44(iStack_3dc,iStack_3e0);
  *(uint8_t *)((long)param_5 + 0x4e) = uVar1;
  *(undefined2 *)((long)param_5 + 0x4c) = uVar2;
  local_370.
  super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
  .bits = (TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
           )((ulong)param_5 | 0x4000000000000);
  BSDF::BSDF(local_3f0,(Vector3f *)(param_3 + 1),(Normal3f *)&param_3[1].dpdx,
             (Normal3f *)&param_3[1].dpdy,(Vector3f *)&param_3[1].uv,&local_370,1.0);
  return pBVar9;
}

Assistant:

PBRT_CPU_GPU BSDF GetBSDF(TextureEvaluator texEval, const MaterialEvalContext &ctx,
                              SampledWavelengths &lambda,
                              CoatedConductorBxDF *bxdf) const {
        Float iurough = texEval(interfaceURoughness, ctx);
        Float ivrough = texEval(interfaceVRoughness, ctx);
        if (remapRoughness) {
            iurough = TrowbridgeReitzDistribution::RoughnessToAlpha(iurough);
            ivrough = TrowbridgeReitzDistribution::RoughnessToAlpha(ivrough);
        }
        TrowbridgeReitzDistribution interfaceDistrib(iurough, ivrough);

        Float thick = texEval(thickness, ctx);
        Float ieta = texEval(interfaceEta, ctx);

        SampledSpectrum ce = texEval(conductorEta, ctx, lambda);
        SampledSpectrum ck = texEval(k, ctx, lambda);
        Float curough = texEval(conductorURoughness, ctx);
        Float cvrough = texEval(conductorVRoughness, ctx);
        if (remapRoughness) {
            curough = TrowbridgeReitzDistribution::RoughnessToAlpha(curough);
            cvrough = TrowbridgeReitzDistribution::RoughnessToAlpha(cvrough);
        }
        TrowbridgeReitzDistribution conductorDistrib(curough, cvrough);

        SampledSpectrum a = Clamp(texEval(albedo, ctx, lambda), 0, 1);
        Float gg = Clamp(texEval(g, ctx), -1, 1);

        *bxdf = CoatedConductorBxDF(DielectricInterfaceBxDF(ieta, interfaceDistrib),
                                    ConductorBxDF(conductorDistrib, ce, ck), thick, a, gg,
                                    config);
        return BSDF(ctx.wo, ctx.n, ctx.ns, ctx.dpdus, bxdf);
    }